

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::SliderBehaviorT<float,float,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,float *v,float v_min,float v_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  uint uVar7;
  float fVar8;
  ImVec2 IVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  pIVar2 = GImGui;
  uVar5 = (ulong)(flags & 1);
  uVar4 = data_type & 0xfffffffe;
  bVar6 = uVar4 == 4;
  bVar1 = power != 1.0;
  fVar13 = (&(bb->Min).x)[uVar5];
  fVar11 = (&(bb->Max).x)[uVar5];
  fVar16 = (fVar11 - fVar13) + -4.0;
  fVar14 = (GImGui->Style).GrabMinSize;
  fVar12 = v_max - v_min;
  fVar15 = (float)(~-(uint)(v_min < v_max) & (uint)(v_min - v_max) |
                  -(uint)(v_min < v_max) & (uint)fVar12);
  if ((uVar4 != 4) && (0.0 <= fVar15)) {
    fVar10 = fVar16 / (fVar15 + 1.0);
    uVar7 = -(uint)(fVar14 <= fVar10);
    fVar14 = (float)(~uVar7 & (uint)fVar14 | (uint)fVar10 & uVar7);
  }
  if (fVar16 <= fVar14) {
    fVar14 = fVar16;
  }
  if ((!bVar1 || !bVar6) || 0.0 <= v_min * v_max) {
    fVar10 = (float)(-(uint)(v_min < 0.0) & 0x3f800000);
  }
  else {
    uVar7 = -(uint)(-v_min <= v_min);
    fVar10 = powf((float)(uVar7 & (uint)v_min | ~uVar7 & (uint)-v_min),1.0 / power);
    uVar7 = -(uint)(-v_max <= v_max);
    fVar8 = powf((float)(uVar7 & (uint)v_max | ~uVar7 & (uint)-v_max),1.0 / power);
    fVar10 = fVar10 / (fVar8 + fVar10);
  }
  fVar13 = fVar13 + 2.0 + fVar14 * 0.5;
  if (pIVar2->ActiveId == id) {
    if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar9 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      fVar16 = IVar9.x;
      if (uVar5 != 0) {
        fVar16 = -IVar9.y;
      }
      if ((pIVar2->NavActivatePressedId == id) && (pIVar2->ActiveIdIsJustActivated == false)) {
        ClearActiveID();
      }
      else if ((fVar16 != 0.0) || (NAN(fVar16))) {
        fVar8 = SliderCalcRatioFromValueT<float,float>(data_type,*v,v_min,v_max,power,fVar10);
        if ((uVar4 != 4) ||
           (iVar3 = ImParseFormatPrecision(format,3), (bool)(~(bVar1 && bVar6) & iVar3 < 1))) {
          if ((ABS(fVar15) <= 100.0) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
            fVar16 = *(float *)(&DAT_001930a8 + (ulong)(fVar16 < 0.0) * 4) / fVar15;
          }
          else {
            fVar16 = fVar16 / 100.0;
          }
        }
        else {
          fVar16 = fVar16 / 100.0;
          if (0.0 < (GImGui->IO).NavInputs[0xe]) {
            fVar16 = fVar16 / 10.0;
          }
        }
        uVar7 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
        fVar15 = (float)(~uVar7 & (uint)fVar16 | (uint)(fVar16 * 10.0) & uVar7);
        if ((1.0 <= fVar8) && (0.0 < fVar15)) {
          bVar1 = false;
          goto LAB_00156cf1;
        }
        if ((fVar8 <= 0.0) && (fVar15 < 0.0)) {
          bVar1 = false;
          goto LAB_00156cf1;
        }
        fVar8 = fVar8 + fVar15;
        fVar15 = 1.0;
        if (fVar8 <= 1.0) {
          fVar15 = fVar8;
        }
        fVar15 = (float)(~-(uint)(fVar8 < 0.0) & (uint)fVar15);
        goto LAB_00156af3;
      }
      bVar1 = false;
      goto LAB_00156cf1;
    }
    if (pIVar2->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar2->IO).MouseDown[0] != false) {
        fVar15 = 0.0;
        if (0.0 < fVar16 - fVar14) {
          fVar16 = (*(float *)((pIVar2->IO).MouseDown + uVar5 * 4 + -8) - fVar13) /
                   (fVar16 - fVar14);
          fVar15 = 1.0;
          if (fVar16 <= 1.0) {
            fVar15 = fVar16;
          }
          fVar15 = (float)(~-(uint)(fVar16 < 0.0) & (uint)fVar15);
        }
        if (uVar5 != 0) {
          fVar15 = 1.0 - fVar15;
        }
LAB_00156af3:
        if (bVar1 && bVar6) {
          if (fVar10 <= fVar15) {
            uVar4 = -(uint)(1e-06 < ABS(fVar10 + -1.0));
            fVar12 = powf((float)(~uVar4 & (uint)fVar15 |
                                 (uint)((fVar15 - fVar10) / (1.0 - fVar10)) & uVar4),power);
            fVar15 = (float)(-(uint)(0.0 <= v_min) & (uint)v_min);
            fVar15 = (v_max - fVar15) * fVar12 + fVar15;
          }
          else {
            fVar12 = powf(1.0 - fVar15 / fVar10,power);
            fVar15 = v_max;
            if (0.0 <= v_max) {
              fVar15 = 0.0;
            }
            fVar15 = (v_min - fVar15) * fVar12 + fVar15;
          }
        }
        else {
          if (uVar4 == 4) {
            fVar15 = fVar12 * fVar15;
          }
          else {
            fVar12 = fVar12 * fVar15;
            fVar15 = fVar12 + 0.5;
            if (fVar12 + 0.5 <= fVar12) {
              fVar15 = fVar12;
            }
          }
          fVar15 = fVar15 + v_min;
        }
        fVar12 = RoundScalarWithFormatT<float,float>(format,data_type,fVar15);
        if ((*v != fVar12) || (NAN(*v) || NAN(fVar12))) {
          *v = fVar12;
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
        goto LAB_00156cf1;
      }
      ClearActiveID();
    }
  }
  bVar1 = false;
LAB_00156cf1:
  fVar12 = SliderCalcRatioFromValueT<float,float>(data_type,*v,v_min,v_max,power,fVar10);
  if (uVar5 != 0) {
    fVar12 = 1.0 - fVar12;
  }
  fVar13 = (((fVar11 + -2.0) - fVar14 * 0.5) - fVar13) * fVar12 + fVar13;
  if (uVar5 == 0) {
    fVar11 = (bb->Min).y + 2.0;
    fVar12 = -fVar14 * 0.5 + fVar13;
    fVar15 = fVar14 * 0.5 + fVar13;
    fVar13 = (bb->Max).y + -2.0;
  }
  else {
    fVar11 = -fVar14 * 0.5 + fVar13;
    fVar12 = (bb->Min).x + 2.0;
    fVar15 = (bb->Max).x + -2.0;
    fVar13 = fVar14 * 0.5 + fVar13;
  }
  (out_grab_bb->Min).x = fVar12;
  (out_grab_bb->Min).y = fVar11;
  (out_grab_bb->Max).x = fVar15;
  (out_grab_bb->Max).y = fVar13;
  return bVar1;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz*0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz*0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f/power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f/power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (!is_decimal && v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    // Output grab position so it can be displayed by the caller
    float grab_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
    if (axis == ImGuiAxis_Y)
        grab_t = 1.0f - grab_t;
    const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
    if (axis == ImGuiAxis_X)
        *out_grab_bb = ImRect(grab_pos - grab_sz*0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz*0.5f, bb.Max.y - grab_padding);
    else
        *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz*0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz*0.5f);

    return value_changed;
}